

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O2

int GetLatestDataMT(MT *pMT,MTDATA *pMTData)

{
  int iVar1;
  uint offset;
  uint uVar2;
  long lVar3;
  uint uVar4;
  double __x;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double yaw;
  double pitch;
  double local_868;
  double local_858;
  double roll;
  int local_83c;
  uchar databuf [2048];
  
  roll = 0.0;
  pitch = 0.0;
  yaw = 0.0;
  if (pMT->bLegacyMode == 0) {
    iVar1 = GetLatestData2MT(pMT,pMTData);
    return iVar1;
  }
  memset(databuf,0,0x800);
  local_83c = 0;
  iVar1 = GetLatestMTMessageMT(pMT,0xff,0x32,databuf,0x800,&local_83c);
  if (iVar1 != 0) {
    return 1;
  }
  memset(pMTData,0,0x130);
  uVar2 = pMT->OutputMode;
  uVar4 = (int)(uVar2 << 0x11) >> 0x1f & 0x14;
  offset = uVar4 + 0x2c;
  if ((uVar2 >> 0xc & 1) == 0) {
    offset = uVar4;
  }
  if ((uVar2 & 1) != 0) {
    offset = ConvertToDoubleMT(pMT->OutputSettings,databuf,offset,&pMTData->temp);
    uVar2 = pMT->OutputMode;
  }
  if ((uVar2 & 2) != 0) {
    uVar2 = pMT->OutputSettings;
    if ((uVar2 & 0x10) == 0) {
      iVar1 = ConvertToDoubleMT(uVar2,databuf,offset,&pMTData->accX);
      iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->accY);
      offset = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->accZ);
      uVar2 = pMT->OutputSettings;
    }
    if ((uVar2 & 0x20) == 0) {
      iVar1 = ConvertToDoubleMT(uVar2,databuf,offset,&pMTData->gyrX);
      iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->gyrY);
      offset = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->gyrZ);
      uVar2 = pMT->OutputSettings;
    }
    if ((uVar2 & 0x40) == 0) {
      iVar1 = ConvertToDoubleMT(uVar2,databuf,offset,&pMTData->magX);
      iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->magY);
      offset = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->magZ);
    }
  }
  uVar2 = pMT->OutputMode;
  if ((uVar2 & 4) == 0) goto LAB_00110cba;
  uVar2 = pMT->OutputSettings;
  if ((uVar2 & 0xc) == 8) {
    iVar1 = ConvertToDoubleMT(uVar2,databuf,offset,&pMTData->a);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->b);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->c);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->d);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->e);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->f);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->g);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->h);
    offset = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->i);
    local_858 = atan2(pMTData->f,pMTData->i);
    dVar7 = pMTData->c;
    __x = -1.0;
    if ((-1.0 <= dVar7) && (__x = 1.0, dVar7 <= 1.0)) {
      __x = dVar7;
    }
    roll = local_858;
    local_868 = asin(__x);
    pitch = -local_868;
    yaw = atan2(pMTData->b,pMTData->a);
    auVar6._0_8_ = local_858 * 180.0;
    auVar6._8_8_ = local_868 * -180.0;
    auVar6 = divpd(auVar6,_DAT_00126170);
    pMTData->roll = (double)auVar6._0_8_;
    pMTData->pitch = (double)auVar6._8_8_;
    dVar7 = local_858;
LAB_00110bb9:
    pMTData->yaw = (yaw * 180.0) / 3.141592653589793;
  }
  else {
    if ((uVar2 & 0xc) != 4) {
      iVar1 = ConvertToDoubleMT(uVar2,databuf,offset,&pMTData->q0);
      iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->q1);
      iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->q2);
      offset = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->q3);
      quaternion2euler(pMTData->q0,pMTData->q1,pMTData->q2,pMTData->q3,&roll,&pitch,&yaw);
      auVar5._0_8_ = roll * 180.0;
      auVar5._8_8_ = pitch * 180.0;
      auVar6 = divpd(auVar5,_DAT_00126170);
      pMTData->roll = (double)auVar6._0_8_;
      pMTData->pitch = (double)auVar6._8_8_;
      dVar7 = roll;
      goto LAB_00110bb9;
    }
    iVar1 = ConvertToDoubleMT(uVar2,databuf,offset,&pMTData->roll);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->pitch);
    offset = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->yaw);
    dVar7 = (pMTData->roll * 3.141592653589793) / 180.0;
    pitch = (pMTData->pitch * 3.141592653589793) / 180.0;
    yaw = (pMTData->yaw * 3.141592653589793) / 180.0;
    roll = dVar7;
  }
  local_858 = pMT->rollorientation + dVar7;
  local_868 = pMT->rollp1;
  dVar7 = cos(dVar7 + pMT->rollp2);
  dVar7 = fmod_2PI(dVar7 * local_868 + local_858);
  pMTData->Roll = dVar7;
  local_858 = pMT->pitchorientation + pitch;
  local_868 = pMT->pitchp1;
  dVar7 = cos(pitch + pMT->pitchp2);
  dVar7 = fmod_2PI(dVar7 * local_868 + local_858);
  pMTData->Pitch = dVar7;
  local_858 = pMT->yaworientation + yaw;
  local_868 = pMT->yawp1;
  dVar7 = cos(yaw + pMT->yawp2);
  dVar7 = fmod_2PI(dVar7 * local_868 + local_858);
  pMTData->Yaw = dVar7;
  uVar2 = pMT->OutputMode;
LAB_00110cba:
  if ((uVar2 & 8) != 0) {
    uVar4 = pMT->OutputSettings;
    if ((uVar4 >> 10 & 1) == 0) {
      pMTData->Ain_1 =
           *(ushort *)(databuf + (int)offset) << 8 | *(ushort *)(databuf + (int)offset) >> 8;
      offset = offset + 2;
    }
    if ((uVar4 >> 0xb & 1) == 0) {
      pMTData->Ain_2 =
           *(ushort *)(databuf + (int)offset) << 8 | *(ushort *)(databuf + (int)offset) >> 8;
      offset = offset + 2;
    }
  }
  if ((uVar2 & 0x10) != 0) {
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,offset,&pMTData->Lat);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->Long);
    offset = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->Alt);
    uVar2 = pMT->OutputMode;
  }
  if ((uVar2 & 0x20) != 0) {
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,offset,&pMTData->Vel_X);
    iVar1 = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->Vel_Y);
    offset = ConvertToDoubleMT(pMT->OutputSettings,databuf,iVar1,&pMTData->Vel_Z);
    uVar2 = pMT->OutputMode;
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    pMTData->Status = databuf[(int)offset];
    offset = offset + 1;
  }
  uVar2 = pMT->OutputSettings;
  if ((uVar2 & 1) != 0) {
    pMTData->TS = *(ushort *)(databuf + (int)offset) << 8 | *(ushort *)(databuf + (int)offset) >> 8;
    offset = offset + 2;
  }
  if ((uVar2 & 2) != 0) {
    lVar3 = (long)(int)offset;
    uVar2 = *(uint *)(databuf + lVar3);
    (pMTData->UTCTime).Nanoseconds =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    (pMTData->UTCTime).Year =
         *(ushort *)(databuf + lVar3 + 4) << 8 | *(ushort *)(databuf + lVar3 + 4) >> 8;
    (pMTData->UTCTime).Month = databuf[lVar3 + 6];
    (pMTData->UTCTime).Day = databuf[lVar3 + 7];
    (pMTData->UTCTime).Hour = databuf[lVar3 + 8];
    (pMTData->UTCTime).Minute = databuf[lVar3 + 9];
    (pMTData->UTCTime).Seconds = databuf[lVar3 + 10];
    (pMTData->UTCTime).Valid = databuf[lVar3 + 0xb];
  }
  memcpy(&pMT->LastMTData,pMTData,0x130);
  return 0;
}

Assistant:

inline int GetLatestDataMT(MT* pMT, MTDATA* pMTData)
{
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	int offset = 0;
	uShort_MT us;
	uInt_MT ul;
	double roll = 0, pitch = 0, yaw = 0;

	// Warning : coordinate system might not be the same between legacy and normal modes!

	if (!pMT->bLegacyMode) return GetLatestData2MT(pMT, pMTData);

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, MTDATA_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	memset(pMTData, 0, sizeof(MTDATA));

	if (pMT->OutputMode & RAW_BIT)
	{
		// Un-calibrated RAW inertial data output mode.
		offset += 20;
	}

	if (pMT->OutputMode & GPS_PVT_BIT)
	{
		// GPS PVT data output mode.
		offset += 44;
	}

	if (pMT->OutputMode & TEMPERATURE_BIT)
	{
		// Temperature data output mode.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->temp);
	}

	if (pMT->OutputMode & CALIBRATED_BIT)
	{
		// Calibrated data output mode.
		if ((pMT->OutputSettings & ACCELERATION) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accZ);
		}
		if ((pMT->OutputSettings & RATE_OF_TURN) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrZ);
		}
		if ((pMT->OutputSettings & MAGNETOMETER) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magZ);
		}
	}

	if (pMT->OutputMode & ORIENTATION_BIT)
	{
		switch (pMT->OutputSettings & ORIENTATION_MODE_MASK)
		{
		case EULER_ANGLES:
			// Orientation data output mode - Euler angles.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->roll);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->pitch);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->yaw);
			roll = pMTData->roll*M_PI/180.0;
			pitch = pMTData->pitch*M_PI/180.0;
			yaw = pMTData->yaw*M_PI/180.0;
			break;
		case MATRIX:
			// Orientation data output mode - Matrix.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->a);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->b);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->c);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->d);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->e);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->f);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->g);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->h);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->i);
			roll = atan2(pMTData->f,pMTData->i);
			pitch = -asin(constrain(pMTData->c, -1, 1)); // Attempt to avoid potential NAN...
			yaw = atan2(pMTData->b,pMTData->a);
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;
			break;
		default:
			// Orientation data output mode - Quaternion.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q0);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q1);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q2);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q3);
			quaternion2euler(pMTData->q0, pMTData->q1, pMTData->q2, pMTData->q3, &roll, &pitch, &yaw);
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;
			break;
		}

		// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
		pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
		pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
		pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
	}

	if (pMT->OutputMode & AUXILIARY_BIT)
	{
		// Auxiliary data output mode.
		if ((pMT->OutputSettings & ANALOG_1) == 0)
		{
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_1 = us.v;
			offset += 2;
		}
		if ((pMT->OutputSettings & ANALOG_2) == 0)
		{
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_2 = us.v;
			offset += 2;
		}
	}

	if (pMT->OutputMode & POSITION_BIT)
	{
		// Position data output mode - LLA.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Lat);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Long);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Alt);
	}

	if (pMT->OutputMode & VELOCITY_BIT)
	{
		// Velocity data output mode - VelXYZ.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_X);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_Y);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_Z);
	}

	if (pMT->OutputMode & STATUS_BIT)
	{
		// Status (1 byte).
		pMTData->Status = databuf[offset];
		offset += 1;
	}

	if (pMT->OutputSettings & SAMPLE_COUNTER)
	{
		// Sample counter (2 bytes).
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		pMTData->TS = us.v;
		offset += 2;
	}

	if (pMT->OutputSettings & UTC_TIME)
	{
		// UTC Time (12 bytes).
		ul.c[0] = databuf[3+offset];
		ul.c[1] = databuf[2+offset];
		ul.c[2] = databuf[1+offset];
		ul.c[3] = databuf[0+offset];
		pMTData->UTCTime.Nanoseconds = ul.v;
		offset += 4;
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		pMTData->UTCTime.Year = us.v;
		offset += 2;
		pMTData->UTCTime.Month = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Day = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Hour = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Minute = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Seconds = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Valid = databuf[offset];
		offset += 1;
	}

	pMT->LastMTData = *pMTData;

	return EXIT_SUCCESS;
}